

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

void flatbuffers::GenComment
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *dc,string *code_ptr,CommentConfig *config,char *prefix)

{
  ulong *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  undefined8 uVar5;
  ulong uVar6;
  pointer __rhs;
  string line_prefix;
  allocator<char> local_f9;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  CommentConfig *local_70;
  char *local_68;
  string *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if ((dc->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (dc->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  local_70 = config;
  local_68 = prefix;
  local_60 = code_ptr;
  local_58 = dc;
  if ((config != (CommentConfig *)0x0) && (config->first_line != (char *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,prefix,(allocator<char> *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,config->first_line,&local_f9);
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar5 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_88 + local_d0._M_string_length) {
      uVar6 = 0xf;
      if (local_90 != local_80) {
        uVar6 = local_80[0];
      }
      if (uVar6 < local_88 + local_d0._M_string_length) goto LAB_001b3a0a;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
    }
    else {
LAB_001b3a0a:
      puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
    }
    local_f8 = &local_e8;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_e8 = *plVar3;
      uStack_e0 = puVar2[3];
    }
    else {
      local_e8 = *plVar3;
      local_f8 = (long *)*puVar2;
    }
    local_f0 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_b0.field_2._M_allocated_capacity = *psVar4;
      local_b0.field_2._8_8_ = plVar3[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar4;
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_60,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,local_68,(allocator<char> *)&local_d0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_8_ = plVar3[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  __rhs = (local_58->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__rhs != (local_58->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::operator+(&local_d0,&local_b0,__rhs);
      puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      plVar3 = puVar2 + 2;
      if ((long *)*puVar2 == plVar3) {
        local_e8 = *plVar3;
        uStack_e0 = puVar2[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *plVar3;
        local_f8 = (long *)*puVar2;
      }
      local_f0 = puVar2[1];
      *puVar2 = plVar3;
      puVar2[1] = 0;
      *(undefined1 *)(puVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_60,(ulong)local_f8);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != (local_58->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((local_70 == (CommentConfig *)0x0) || (local_70->last_line == (char *)0x0)) goto LAB_001b3eb7;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_68,&local_f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,local_70->last_line,&local_d1);
  uVar6 = 0xf;
  if (local_90 != local_80) {
    uVar6 = local_80[0];
  }
  if (uVar6 < (ulong)(local_48 + local_88)) {
    uVar6 = 0xf;
    if (local_50 != local_40) {
      uVar6 = local_40[0];
    }
    if (uVar6 < (ulong)(local_48 + local_88)) goto LAB_001b3d75;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_001b3d75:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  puVar1 = puVar2 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_d0.field_2._M_allocated_capacity = *puVar1;
    local_d0.field_2._8_8_ = puVar2[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar1;
    local_d0._M_dataplus._M_p = (pointer)*puVar2;
  }
  local_d0._M_string_length = puVar2[1];
  *puVar2 = puVar1;
  puVar2[1] = 0;
  *(undefined1 *)puVar1 = 0;
  puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_e8 = *plVar3;
    uStack_e0 = puVar2[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar3;
    local_f8 = (long *)*puVar2;
  }
  local_f0 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)(puVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_60,(ulong)local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
LAB_001b3eb7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenComment(const std::vector<std::string> &dc, std::string *code_ptr,
                const CommentConfig *config, const char *prefix) {
  if (dc.begin() == dc.end()) {
    // Don't output empty comment blocks with 0 lines of comment content.
    return;
  }

  std::string &code = *code_ptr;
  if (config != nullptr && config->first_line != nullptr) {
    code += std::string(prefix) + std::string(config->first_line) + "\n";
  }
  std::string line_prefix =
      std::string(prefix) +
      ((config != nullptr && config->content_line_prefix != nullptr)
           ? config->content_line_prefix
           : "///");
  for (auto it = dc.begin(); it != dc.end(); ++it) {
    code += line_prefix + *it + "\n";
  }
  if (config != nullptr && config->last_line != nullptr) {
    code += std::string(prefix) + std::string(config->last_line) + "\n";
  }
}